

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O1

int archive_compressor_xz_options(archive_write_filter *f,char *key,char *value)

{
  byte bVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  
  puVar2 = (uint *)f->data;
  iVar3 = strcmp(key,"compression-level");
  if (iVar3 == 0) {
    if (value == (char *)0x0) {
      return -0x14;
    }
    bVar1 = *value - 0x30;
    if (9 < bVar1) {
      return -0x14;
    }
    if (value[1] != '\0') {
      return -0x14;
    }
    uVar6 = 6;
    if (*value < '7') {
      uVar6 = (uint)bVar1;
    }
    *puVar2 = uVar6;
  }
  else {
    iVar3 = strcmp(key,"threads");
    if (value == (char *)0x0) {
      return -0x14;
    }
    if (iVar3 != 0) {
      return -0x14;
    }
    uVar4 = strtoul(value,(char **)0x0,10);
    puVar2[1] = (uint)uVar4;
    if ((uint)uVar4 == 0) {
      piVar5 = __errno_location();
      if (*piVar5 != 0) {
        puVar2[1] = 1;
        return -0x14;
      }
      puVar2[1] = 1;
    }
  }
  return 0;
}

Assistant:

static int
archive_compressor_xz_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		if (data->compression_level > 6)
			data->compression_level = 6;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		if (value == NULL)
			return (ARCHIVE_WARN);
		data->threads = (int)strtoul(value, NULL, 10);
		if (data->threads == 0 && errno != 0) {
			data->threads = 1;
			return (ARCHIVE_WARN);
		}
		if (data->threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			data->threads = lzma_cputhreads();
#else
			data->threads = 1;
#endif
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}